

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTEventLog.h
# Opt level: O0

EventLogEntry * __thiscall
TTD::EventLog::
RecordGetInitializedEvent<TTD::NSLogEvents::JsRTDoubleArgumentAction,(TTD::NSLogEvents::EventKind)19>
          (EventLog *this,JsRTDoubleArgumentAction **extraData)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  EventLogEntry *evt;
  int64 etime;
  JsRTDoubleArgumentAction *pJVar4;
  EventLogEntry *res;
  JsRTDoubleArgumentAction **extraData_local;
  EventLog *this_local;
  
  if (this->m_eventListVTable[0x13].DataSize != 0x20) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Debug/TTEventLog.h"
                       ,0x118,
                       "((((sizeof(TTD::NSLogEvents::EventLogEntry) + sizeof(T)) + 0x3) & 0xFFFFFFFC) == this->m_eventListVTable[(uint32)tag].DataSize)"
                       ,"Computed and extracted data sizes don\'t match!!!");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  evt = TTEventList::GetNextAvailableEntry<TTD::NSLogEvents::JsRTDoubleArgumentAction>
                  (&this->m_eventList);
  etime = GetCurrentEventTimeAndAdvance(this);
  NSLogEvents::EventLogEntry_Initialize<(TTD::NSLogEvents::EventKind)19>(evt,etime);
  pJVar4 = NSLogEvents::
           GetInlineEventDataAs<TTD::NSLogEvents::JsRTDoubleArgumentAction,(TTD::NSLogEvents::EventKind)19>
                     (evt);
  *extraData = pJVar4;
  return evt;
}

Assistant:

NSLogEvents::EventLogEntry* RecordGetInitializedEvent(T** extraData)
        {
            AssertMsg(TTD_EVENT_PLUS_DATA_SIZE_DIRECT(sizeof(T)) == this->m_eventListVTable[(uint32)tag].DataSize, "Computed and extracted data sizes don't match!!!");

            NSLogEvents::EventLogEntry* res = this->m_eventList.GetNextAvailableEntry<T>();
            NSLogEvents::EventLogEntry_Initialize<tag>(res, this->GetCurrentEventTimeAndAdvance());

            *extraData = NSLogEvents::GetInlineEventDataAs<T, tag>(res);
            return res;
        }